

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_handler_EAT_FOOD(melee_effect_handler_context_t *context)

{
  object *obj_00;
  _Bool _Var1;
  char cVar2;
  uint32_t uVar3;
  _Bool local_79;
  char local_78 [7];
  _Bool none_left;
  char o_name [80];
  object *eaten;
  object *obj;
  wchar_t index;
  wchar_t tries;
  melee_effect_handler_context_t *context_local;
  
  _Var1 = monster_damage_target(context,true);
  if (!_Var1) {
    for (obj._4_4_ = 0; obj._4_4_ < 10; obj._4_4_ = obj._4_4_ + 1) {
      uVar3 = Rand_div((uint)z_info->pack_size);
      local_79 = false;
      obj_00 = context->p->upkeep->inven[(int)uVar3];
      if ((obj_00 != (object *)0x0) && (_Var1 = tval_is_edible(obj_00), _Var1)) {
        if (obj_00->number == '\x01') {
          object_desc(local_78,0x50,obj_00,0,context->p);
          cVar2 = gear_to_label(context->p,obj_00);
          msg("Your %s (%c) was eaten!",local_78,(ulong)(uint)(int)cVar2);
        }
        else {
          object_desc(local_78,0x50,obj_00,0x40,context->p);
          cVar2 = gear_to_label(context->p,obj_00);
          msg("One of your %s (%c) was eaten!",local_78,(ulong)(uint)(int)cVar2);
        }
        o_name._72_8_ = gear_object_for_use(context->p,obj_00,L'\x01',false,&local_79);
        if (((object *)o_name._72_8_)->known != (object *)0x0) {
          object_delete((chunk *)player->cave,(chunk *)0x0,&((object *)o_name._72_8_)->known);
        }
        object_delete((chunk *)cave,(chunk *)player->cave,(object **)(o_name + 0x48));
        context->obvious = true;
        return;
      }
    }
  }
  return;
}

Assistant:

static void melee_effect_handler_EAT_FOOD(melee_effect_handler_context_t *context)
{
	int tries;

	/* Take damage */
	if (monster_damage_target(context, true)) return;

	/* Steal some food */
	for (tries = 0; tries < 10; tries++) {
		/* Pick an item from the pack */
		int index = randint0(z_info->pack_size);
		struct object *obj, *eaten;
		char o_name[80];
		bool none_left = false;

		/* Get the item */
		obj = context->p->upkeep->inven[index];

		/* Skip non-objects */
		if (obj == NULL) continue;

		/* Skip non-food objects */
		if (!tval_is_edible(obj)) continue;

		if (obj->number == 1) {
			object_desc(o_name, sizeof(o_name), obj, ODESC_BASE,
				context->p);
			msg("Your %s (%c) was eaten!", o_name,
				gear_to_label(context->p, obj));
		} else {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_BASE, context->p);
			msg("One of your %s (%c) was eaten!", o_name,
				gear_to_label(context->p, obj));
		}

		/* Steal and eat */
		eaten = gear_object_for_use(context->p, obj, 1, false,
			&none_left);
		if (eaten->known)
			object_delete(player->cave, NULL, &eaten->known);
		object_delete(cave, player->cave, &eaten);

		/* Obvious */
		context->obvious = true;

		/* Done */
		break;
	}
}